

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O0

bool tcu::matchWildcards(const_iterator patternStart,const_iterator patternEnd,
                        const_iterator pathStart,const_iterator pathEnd,bool allowPrefix)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  reference pcVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  const_iterator path;
  const_iterator pattern;
  const_iterator cStack_30;
  bool allowPrefix_local;
  const_iterator pathEnd_local;
  const_iterator pathStart_local;
  const_iterator patternEnd_local;
  const_iterator patternStart_local;
  
  local_48._M_current = pathStart._M_current;
  path._M_current = patternStart._M_current;
  cStack_30._M_current = pathEnd._M_current;
  pathEnd_local._M_current = pathStart._M_current;
  pathStart_local._M_current = patternEnd._M_current;
  while( true ) {
    bVar2 = __gnu_cxx::operator!=(&path,&pathStart_local);
    bVar3 = false;
    if (bVar2) {
      bVar2 = __gnu_cxx::operator!=(&local_48,&stack0xffffffffffffffd0);
      bVar3 = false;
      if (bVar2) {
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&path);
        cVar1 = *pcVar4;
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_48);
        bVar3 = cVar1 == *pcVar4;
      }
    }
    if (!bVar3) break;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&path);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_48);
  }
  bVar3 = __gnu_cxx::operator==(&path,&pathStart_local);
  if (bVar3) {
    patternStart_local._M_current._7_1_ = __gnu_cxx::operator==(&local_48,&stack0xffffffffffffffd0);
  }
  else {
    pcVar4 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&path);
    if (*pcVar4 == '*') {
      while (bVar3 = __gnu_cxx::operator!=(&local_48,&stack0xffffffffffffffd0), bVar3) {
        _Var5 = __gnu_cxx::
                __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator+(&path,1);
        bVar3 = matchWildcards((const_iterator)_Var5._M_current,pathStart_local,
                               (const_iterator)local_48._M_current,cStack_30,allowPrefix);
        if (bVar3) {
          return true;
        }
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_48);
      }
      _Var5 = __gnu_cxx::
              __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator+(&path,1);
      bVar3 = matchWildcards((const_iterator)_Var5._M_current,pathStart_local,cStack_30,cStack_30,
                             allowPrefix);
      if (bVar3) {
        return true;
      }
    }
    else {
      bVar3 = __gnu_cxx::operator==(&local_48,&stack0xffffffffffffffd0);
      if ((bVar3) && (allowPrefix)) {
        return true;
      }
    }
    patternStart_local._M_current._7_1_ = false;
  }
  return patternStart_local._M_current._7_1_;
}

Assistant:

static bool matchWildcards(string::const_iterator	patternStart,
						   string::const_iterator	patternEnd,
						   string::const_iterator	pathStart,
						   string::const_iterator	pathEnd,
						   bool						allowPrefix)
{
	string::const_iterator	pattern	= patternStart;
	string::const_iterator	path	= pathStart;

	while (pattern != patternEnd && path != pathEnd && *pattern == *path)
	{
		++pattern;
		++path;
	}

	if (pattern == patternEnd)
		return (path == pathEnd);
	else if (*pattern == '*')
	{
		for (; path != pathEnd; ++path)
		{
			if (matchWildcards(pattern + 1, patternEnd, path, pathEnd, allowPrefix))
				return true;
		}

		if (matchWildcards(pattern + 1, patternEnd, pathEnd, pathEnd, allowPrefix))
			return true;
	}
	else if (path == pathEnd && allowPrefix)
		return true;

	return false;
}